

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

State __thiscall tcu::TestHierarchyIterator::getState(TestHierarchyIterator *this)

{
  bool bVar1;
  State SVar2;
  const_reference this_00;
  NodeIter *iter;
  TestHierarchyIterator *this_local;
  
  bVar1 = std::
          vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
          ::empty(&this->m_sessionStack);
  if (bVar1) {
    this_local._4_4_ = STATE_FINISHED;
  }
  else {
    this_00 = std::
              vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
              ::back(&this->m_sessionStack);
    SVar2 = NodeIter::getState(this_00);
    this_local._4_4_ = (State)(SVar2 != STATE_ENTER);
  }
  return this_local._4_4_;
}

Assistant:

TestHierarchyIterator::State TestHierarchyIterator::getState (void) const
{
	if (!m_sessionStack.empty())
	{
		const NodeIter&	iter	= m_sessionStack.back();

		DE_ASSERT(iter.getState() == NodeIter::STATE_ENTER ||
				  iter.getState() == NodeIter::STATE_LEAVE);

		return iter.getState() == NodeIter::STATE_ENTER ? STATE_ENTER_NODE : STATE_LEAVE_NODE;
	}
	else
		return STATE_FINISHED;
}